

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_tuple_management.hpp
# Opt level: O1

void burst::management::manage<std::vector<unsigned_long,std::allocator<unsigned_long>>>
               (operation_t todo,void *source,void *destination)

{
  void *pvVar1;
  
  switch(todo) {
  case copy:
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)destination,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)source);
    return;
  case move:
    *(undefined8 *)destination = *source;
    *(undefined8 *)((long)destination + 8) = *(undefined8 *)((long)source + 8);
    *(undefined8 *)((long)destination + 0x10) = *(undefined8 *)((long)source + 0x10);
    *(undefined8 *)source = 0;
    *(undefined8 *)((long)source + 8) = 0;
    *(undefined8 *)((long)source + 0x10) = 0;
    break;
  case destroy:
    if (source != (void *)0x0) {
      __assert_fail("source == nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/container/detail/dynamic_tuple_management.hpp"
                    ,0x56,
                    "void burst::management::manage(operation_t, const void *, void *) [T = std::vector<unsigned long>]"
                   );
    }
    pvVar1 = *destination;
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)destination + 0x10) - (long)pvVar1);
      return;
    }
    break;
  case size:
    if (source != (void *)0x0) {
      __assert_fail("source == nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/container/detail/dynamic_tuple_management.hpp"
                    ,0x5c,
                    "void burst::management::manage(operation_t, const void *, void *) [T = std::vector<unsigned long>]"
                   );
    }
    *(undefined8 *)destination = 0x18;
    break;
  case type:
    if (source != (void *)0x0) {
      __assert_fail("source == nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/container/detail/dynamic_tuple_management.hpp"
                    ,0x62,
                    "void burst::management::manage(operation_t, const void *, void *) [T = std::vector<unsigned long>]"
                   );
    }
    *(pointer_____offset_0x10___ **)destination =
         &std::vector<unsigned_long,std::allocator<unsigned_long>>::typeinfo;
  }
  return;
}

Assistant:

void manage (operation_t todo, const void * source, void * destination)
        {
            switch (todo)
            {
                case operation_t::copy:
                {
                    copy<T>(source, destination);
                    break;
                }
                case operation_t::move:
                {
                    move<T>(const_cast<void *>(source), destination);
                    break;
                }
                case operation_t::destroy:
                {
                    assert(source == nullptr);
                    destroy<T>(destination);
                    break;
                }
                case operation_t::size:
                {
                    assert(source == nullptr);
                    *static_cast<std::size_t *>(destination) = sizeof(T);
                    break;
                }
                case operation_t::type:
                {
                    assert(source == nullptr);
                    *static_cast<const std::type_info **>(destination) = std::addressof(typeid(T));
                    break;
                }
            }
        }